

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int GetLast360DataFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,int *pNbMeasurements)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  
  lVar17 = 0;
  lVar10 = 0;
  while (*(RPLIDAR **)((long)addrsRPLIDAR + lVar17 * 2) != pRPLIDAR) {
    lVar10 = lVar10 + 0x28;
    lVar17 = lVar17 + 4;
    if (lVar10 == 0x280) {
      return 1;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)RPLIDARCS + lVar10));
  lVar15 = *(long *)((long)&anglesvectorRPLIDAR[0].
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node + lVar10 * 2);
  lVar2 = *(long *)((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node + lVar10 * 2);
  lVar3 = *(long *)((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar10 * 2);
  uVar7 = (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_start._M_last + lVar10 * 2) -
                       lVar3) >> 3) +
          (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_cur + lVar10 * 2) -
                       *(long *)((long)&anglesvectorRPLIDAR[0].
                                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                        super__Deque_impl_data._M_finish._M_first + lVar10 * 2)) >>
               3) + ((int)((ulong)(lVar15 - lVar2) >> 3) + -1 + (uint)(lVar15 == 0)) * 0x40;
  *pNbMeasurements = uVar7;
  if (0 < (int)uVar7) {
    lVar12 = lVar3 - *(long *)((long)&anglesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_start._M_first + lVar10 * 2) >> 3;
    lVar4 = *(long *)((long)&distancesvectorRPLIDAR[0].
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur + lVar10 * 2);
    lVar5 = *(long *)((long)&distancesvectorRPLIDAR[0].
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node + lVar10 * 2);
    lVar13 = lVar4 - *(long *)((long)&distancesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_start._M_first + lVar10 * 2) >> 3;
    uVar8 = (ulong)(uVar7 & 0x7fffffff);
    uVar14 = uVar8 + 1;
    lVar15 = (lVar12 + uVar8) * 8;
    lVar11 = (lVar13 + uVar8) * 8;
    do {
      lVar15 = lVar15 + -8;
      lVar11 = lVar11 + -8;
      uVar8 = uVar8 - 1;
      uVar9 = (lVar12 + uVar14) - 2;
      if ((long)uVar9 < 0) {
        uVar9 = (long)uVar9 >> 6;
LAB_0010ef49:
        pdVar16 = (double *)(*(long *)(lVar2 + uVar9 * 8) + uVar9 * -0x200 + lVar15);
      }
      else {
        if (0x3f < uVar9) {
          uVar9 = uVar9 >> 6;
          goto LAB_0010ef49;
        }
        pdVar16 = (double *)(lVar3 + uVar8 * 8);
      }
      pAngles[uVar14 - 2] = *pdVar16;
      uVar9 = (lVar13 + uVar14) - 2;
      if ((long)uVar9 < 0) {
        uVar9 = (long)uVar9 >> 6;
LAB_0010ef84:
        pdVar16 = (double *)(*(long *)(lVar5 + uVar9 * 8) + uVar9 * -0x200 + lVar11);
      }
      else {
        if (0x3f < uVar9) {
          uVar9 = uVar9 >> 6;
          goto LAB_0010ef84;
        }
        pdVar16 = (double *)(lVar4 + uVar8 * 8);
      }
      pDistances[uVar14 - 2] = *pdVar16;
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
  }
  iVar1 = *(int *)((long)resRPLIDAR + lVar17);
  pthread_mutex_unlock((pthread_mutex_t *)((long)RPLIDARCS + lVar10));
  iVar6 = 2;
  if (0 < *pNbMeasurements) {
    iVar6 = iVar1;
  }
  return iVar6;
}

Assistant:

HARDWAREX_API int GetLast360DataFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, int* pNbMeasurements)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	*pNbMeasurements = (int)anglesvectorRPLIDAR[id].size();
	for (int i = *pNbMeasurements-1; i >= 0; i--)
	{
		pAngles[i] = anglesvectorRPLIDAR[id][i];
		pDistances[i] = distancesvectorRPLIDAR[id][i];
	}
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	if (*pNbMeasurements <= 0) return EXIT_TIMEOUT;
	return res;
#else
	return EXIT_NOT_IMPLEMENTED;
#endif // __cplusplus
}